

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_srand(uint seed)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x270; lVar1 = lVar1 + 1) {
    seed = seed * 0x7ff8a3ed + 0x2aa01d31;
    stb__mt_buffer[lVar1] = (seed * 0x10000 | seed >> 0x10) ^ 0x31415926;
  }
  stb__mt_index = 0x9c0;
  return;
}

Assistant:

void stb_srand(unsigned int seed)
{
   int i;
   unsigned int old = stb_srandLCG(seed);
   for (i = 0; i < STB__MT_LEN; i++)
      stb__mt_buffer[i] = stb_randLCG();
   stb_srandLCG(old);
   stb__mt_index = STB__MT_LEN*sizeof(unsigned int);
}